

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O2

int regexec(regex_t *__preg,char *__string,size_t __nmatch,regmatch_t *__pmatch,int __eflags)

{
  undefined8 *puVar1;
  re_guts *prVar2;
  sopno stop;
  sop *psVar3;
  undefined8 uVar4;
  re_guts *prVar5;
  regmatch_t *prVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  regmatch_t rVar13;
  ulong uVar14;
  char *pcVar15;
  ushort **ppuVar16;
  char *pcVar17;
  regmatch_t *prVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  ushort *puVar22;
  ushort uVar23;
  char *pcVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  size_t sVar29;
  long lVar30;
  long lVar31;
  sop sVar32;
  long lVar33;
  undefined8 *puVar34;
  int iVar35;
  long lVar36;
  size_t sVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  char *local_120;
  char *local_110;
  char *local_d0;
  lmat local_c0;
  uint local_4c;
  long local_48;
  uint local_3c;
  size_t local_38;
  
  if (*(int *)&__preg->buffer != 0xf265) {
    return 2;
  }
  prVar2 = (re_guts *)__preg->syntax;
  if (prVar2->magic != 0xd245) {
    return 2;
  }
  if ((prVar2->iflags & 4) != 0) {
    return 2;
  }
  uVar26 = prVar2->nstates;
  local_c0.g = prVar2;
  local_c0.offp = __string;
  if (0x20 < uVar26) {
    lVar39 = prVar2->firststate;
    stop = prVar2->laststate;
    uVar14 = 0;
    if ((prVar2->cflags & 4) == 0) {
      uVar14 = __nmatch;
    }
    if ((__eflags & 4U) == 0) {
      rVar13 = (regmatch_t)strlen(__string);
      pcVar24 = __string;
    }
    else {
      pcVar24 = __string + (long)*__pmatch;
      rVar13 = __pmatch[1];
    }
    pcVar15 = __string + (long)rVar13;
    lVar36 = (long)pcVar15 - (long)pcVar24;
    if (pcVar15 < pcVar24) {
      return 0x10;
    }
    pcVar17 = prVar2->must;
    pcVar21 = pcVar24;
    if (pcVar17 != (char *)0x0) {
      while ((pcVar21 < pcVar15 &&
             (((*pcVar21 != *pcVar17 || (lVar36 < prVar2->mlen)) ||
              (iVar7 = bcmp(pcVar21,pcVar17,(long)prVar2->mlen), iVar7 != 0))))) {
        lVar36 = lVar36 + -1;
        pcVar21 = pcVar21 + 1;
      }
      if (pcVar21 == pcVar15) {
        return 1;
      }
    }
    local_c0.pmatch = (regmatch_t *)0x0;
    local_c0.lastpos = (char **)0x0;
    local_c0.eflags = __eflags & 7;
    local_c0.beginp = pcVar24;
    local_c0.endp = pcVar15;
    pcVar17 = (char *)malloc(uVar26 * 4);
    if (pcVar17 == (char *)0x0) {
      return 0xc;
    }
    lVar39 = lVar39 + 1;
    local_c0.st._0_4_ = SUB84(pcVar17,0);
    local_c0.st._4_4_ = (undefined4)((ulong)pcVar17 >> 0x20);
    local_d0 = pcVar17 + uVar26 * 2;
    local_c0.vn = 4;
    local_c0.empty = pcVar17 + uVar26 * 3;
    local_c0.space = pcVar17;
    local_c0.fresh = pcVar17 + uVar26;
    local_c0.tmp = local_d0;
    memset(local_c0.empty,0,uVar26);
    iVar7 = 0xc;
    pcVar21 = pcVar24;
    pcVar20 = pcVar17 + uVar26;
LAB_00107597:
    if (pcVar21 == pcVar24) {
      iVar25 = 0x80;
    }
    else {
      iVar25 = (int)pcVar24[-1];
    }
    memset(pcVar17,0,(local_c0.g)->nstates);
    pcVar17[lVar39] = '\x01';
    lstep(local_c0.g,lVar39,stop,pcVar17,0x84,pcVar17);
    memcpy(pcVar20,pcVar17,(local_c0.g)->nstates);
    local_110 = (char *)0x0;
    do {
      prVar5 = local_c0.g;
      if (pcVar24 == local_c0.endp) {
        iVar10 = 0x80;
      }
      else {
        iVar10 = (int)*pcVar24;
      }
      iVar12 = bcmp(pcVar17,pcVar20,(local_c0.g)->nstates);
      if (iVar12 == 0) {
        local_110 = pcVar24;
      }
      iVar12 = 0;
      iVar27 = 0x82;
      if (iVar25 == 0x80) {
        iVar35 = 0;
        iVar12 = 0;
        if ((local_c0.eflags & 1U) == 0) {
LAB_00107685:
          iVar35 = prVar5->nbol;
          iVar27 = 0x83;
          iVar12 = 0x81;
        }
      }
      else if (iVar25 == 10) {
        iVar35 = 0;
        if ((prVar5->cflags & 8) != 0) goto LAB_00107685;
      }
      else {
        iVar35 = 0;
        iVar12 = 0;
      }
      if (iVar10 == 0x80) {
        if ((local_c0.eflags & 2U) == 0) goto LAB_001076bc;
      }
      else if ((iVar10 == 10) && ((prVar5->cflags & 8) != 0)) {
LAB_001076bc:
        iVar35 = iVar35 + prVar5->neol;
        iVar12 = iVar27;
      }
      if (0 < iVar35) {
        uVar8 = iVar35 + 1;
        do {
          lstep(local_c0.g,lVar39,stop,pcVar17,iVar12,pcVar17);
          uVar8 = uVar8 - 1;
        } while (1 < uVar8);
      }
      if (iVar12 == 0x81) {
        iVar27 = 0x81;
        if (iVar10 != 0x80) {
          ppuVar16 = __ctype_b_loc();
          puVar22 = *ppuVar16;
LAB_00107750:
          if (iVar10 == 0x5f) {
            iVar12 = 0x85;
          }
          iVar27 = iVar12;
          if ((puVar22[iVar10] & 8) != 0) {
            iVar27 = 0x85;
          }
        }
        iVar12 = iVar27;
        if (iVar25 == 0x80) goto LAB_001077a9;
        ppuVar16 = __ctype_b_loc();
        puVar22 = *ppuVar16;
        uVar23 = puVar22[iVar25] & 8;
LAB_0010779a:
        if (((uVar23 == 0) && (iVar25 != 0x5f)) ||
           ((iVar25 = 0x86, iVar12 != 0x82 &&
            (((iVar10 == 0x80 || ((puVar22[iVar10] & 8) != 0)) || (iVar10 == 0x5f))))))
        goto LAB_001077a9;
LAB_001077ce:
        lstep(local_c0.g,lVar39,stop,pcVar17,iVar25,pcVar17);
      }
      else {
        if (iVar25 != 0x80) {
          ppuVar16 = __ctype_b_loc();
          puVar22 = *ppuVar16;
          uVar23 = puVar22[iVar25] & 8;
          if (((uVar23 == 0) && (iVar25 != 0x5f)) && (iVar10 != 0x80)) goto LAB_00107750;
          goto LAB_0010779a;
        }
LAB_001077a9:
        iVar25 = iVar12;
        if (iVar12 - 0x85U < 2) goto LAB_001077ce;
      }
      if ((pcVar24 == pcVar15) || (pcVar17[stop] != '\0')) goto LAB_0010787f;
      memcpy(local_d0,pcVar17,(local_c0.g)->nstates);
      memcpy(pcVar17,pcVar20,(local_c0.g)->nstates);
      lstep(local_c0.g,lVar39,stop,local_d0,iVar10,pcVar17);
      pcVar24 = pcVar24 + 1;
      iVar25 = iVar10;
    } while( true );
  }
  lVar39 = prVar2->firststate;
  lVar36 = prVar2->laststate;
  sVar37 = 0;
  if ((prVar2->cflags & 4) == 0) {
    sVar37 = __nmatch;
  }
  if ((__eflags & 4U) == 0) {
    rVar13 = (regmatch_t)strlen(__string);
    pcVar24 = __string;
  }
  else {
    pcVar24 = __string + (long)*__pmatch;
    rVar13 = __pmatch[1];
  }
  pcVar15 = __string + (long)rVar13;
  lVar30 = (long)pcVar15 - (long)pcVar24;
  if (pcVar15 < pcVar24) {
    return 0x10;
  }
  pcVar17 = prVar2->must;
  pcVar21 = pcVar24;
  local_38 = sVar37;
  if (pcVar17 != (char *)0x0) {
    while ((pcVar21 < pcVar15 &&
           (((*pcVar21 != *pcVar17 || (lVar30 < prVar2->mlen)) ||
            (iVar7 = bcmp(pcVar21,pcVar17,(long)prVar2->mlen), iVar7 != 0))))) {
      lVar30 = lVar30 + -1;
      pcVar21 = pcVar21 + 1;
    }
    if (pcVar21 == pcVar15) {
      return 1;
    }
  }
  local_c0.eflags = __eflags & 7;
  local_c0.pmatch = (regmatch_t *)0x0;
  local_c0.lastpos = (char **)0x0;
  lVar39 = lVar39 + 1;
  local_3c = 1 << ((byte)lVar39 & 0x1f);
  uVar8 = 1 << ((byte)lVar36 & 0x1f);
  local_c0._68_4_ = 0;
  local_c0.space = (char *)0x0;
  local_c0.st._0_4_ = 0;
  local_c0.beginp = pcVar24;
  local_c0.endp = pcVar15;
  local_48 = lVar39;
LAB_00106d9f:
  prVar5 = local_c0.g;
  if (local_c0.beginp == pcVar24) {
    iVar7 = 0x80;
  }
  else {
    iVar7 = (int)pcVar24[-1];
  }
  uVar9 = sstep(local_c0.g,lVar39,lVar36,local_3c,0x84,local_3c);
  pcVar17 = local_c0.endp;
  local_4c = local_c0.eflags;
  pcVar21 = (char *)0x0;
  uVar11 = uVar9;
  do {
    if (pcVar24 == pcVar17) {
      iVar25 = 0x80;
    }
    else {
      iVar25 = (int)*pcVar24;
    }
    if (uVar11 == uVar9) {
      pcVar21 = pcVar24;
    }
    iVar10 = 0;
    iVar12 = 0x82;
    if (iVar7 == 0x80) {
      iVar27 = 0;
      iVar10 = 0;
      if ((local_4c & 1) == 0) {
LAB_00106e54:
        iVar27 = prVar5->nbol;
        iVar12 = 0x83;
        iVar10 = 0x81;
      }
    }
    else if (iVar7 == 10) {
      iVar27 = 0;
      if ((prVar5->cflags & 8) != 0) goto LAB_00106e54;
    }
    else {
      iVar27 = 0;
    }
    if (iVar25 == 0x80) {
      if ((local_4c & 2) == 0) goto LAB_00106e8c;
    }
    else if ((iVar25 == 10) && ((prVar5->cflags & 8) != 0)) {
LAB_00106e8c:
      iVar27 = iVar27 + prVar5->neol;
      iVar10 = iVar12;
    }
    if (0 < iVar27) {
      uVar28 = iVar27 + 1;
      do {
        uVar11 = sstep(prVar5,lVar39,lVar36,uVar11,iVar10,uVar11);
        uVar28 = uVar28 - 1;
      } while (1 < uVar28);
    }
    if (iVar10 == 0x81) {
      iVar12 = 0x81;
      if (iVar25 != 0x80) {
        ppuVar16 = __ctype_b_loc();
        puVar22 = *ppuVar16;
LAB_00106f34:
        if (iVar25 == 0x5f) {
          iVar10 = 0x85;
        }
        iVar12 = iVar10;
        if ((puVar22[iVar25] & 8) != 0) {
          iVar12 = 0x85;
        }
      }
      iVar10 = iVar12;
      if (iVar7 == 0x80) goto LAB_00106f8d;
      ppuVar16 = __ctype_b_loc();
      puVar22 = *ppuVar16;
      uVar23 = puVar22[iVar7] & 8;
LAB_00106f83:
      if (((uVar23 == 0) && (iVar7 != 0x5f)) ||
         ((iVar7 = 0x86, iVar10 != 0x82 &&
          (((iVar25 == 0x80 || ((puVar22[iVar25] & 8) != 0)) || (iVar25 == 0x5f))))))
      goto LAB_00106f8d;
LAB_00106fab:
      uVar11 = sstep(prVar5,lVar39,lVar36,uVar11,iVar7,uVar11);
    }
    else {
      if (iVar7 != 0x80) {
        ppuVar16 = __ctype_b_loc();
        puVar22 = *ppuVar16;
        uVar23 = puVar22[iVar7] & 8;
        if (((uVar23 == 0) && (iVar7 != 0x5f)) && (iVar25 != 0x80)) goto LAB_00106f34;
        goto LAB_00106f83;
      }
LAB_00106f8d:
      iVar7 = iVar10;
      if (iVar10 - 0x85U < 2) goto LAB_00106fab;
    }
    sVar37 = local_38;
    if ((pcVar24 == pcVar15) || ((uVar11 & uVar8) != 0)) goto LAB_00107041;
    uVar11 = sstep(prVar5,lVar39,lVar36,uVar11,iVar25,uVar9);
    pcVar24 = pcVar24 + 1;
    iVar7 = iVar25;
  } while( true );
LAB_0010787f:
  local_c0.coldp = local_110;
  if (pcVar17[stop] == '\0') {
    iVar7 = 1;
    goto LAB_00107e8c;
  }
  if ((uVar14 == 0) && (prVar2->backrefs == 0)) goto LAB_00107e6d;
  while (local_c0.coldp = local_110, pcVar24 = lslow(&local_c0,local_110,pcVar15,lVar39,stop),
        pcVar24 == (char *)0x0) {
    local_110 = local_c0.coldp + 1;
  }
  if ((uVar14 == 1) && (prVar2->backrefs == 0)) goto LAB_00107e04;
  sVar29 = (local_c0.g)->nsub;
  prVar18 = local_c0.pmatch;
  if ((local_c0.pmatch == (regmatch_t *)0x0) &&
     (prVar18 = (regmatch_t *)malloc(sVar29 * 0x10 + 0x10), local_c0.pmatch = prVar18,
     prVar18 == (regmatch_t *)0x0)) goto LAB_00107e8c;
  while( true ) {
    prVar6 = local_c0.pmatch;
    bVar40 = sVar29 == 0;
    sVar29 = sVar29 - 1;
    if (bVar40) break;
    *(undefined4 *)&prVar18[1].rm_so = 0xffffffff;
    *(undefined4 *)((long)&prVar18[1].rm_so + 4) = 0xffffffff;
    *(undefined4 *)&prVar18[1].rm_eo = 0xffffffff;
    *(undefined4 *)((long)&prVar18[1].rm_eo + 4) = 0xffffffff;
    prVar18 = prVar18 + 1;
  }
  if ((prVar2->backrefs == 0) &&
     (pcVar17 = local_c0.coldp, lVar36 = lVar39, (local_c0.eflags & 0x400U) == 0)) {
switchD_00107a13_caseD_2:
    lVar30 = lVar36;
    pcVar21 = pcVar17;
    if (lVar30 < stop) {
      sVar32 = (local_c0.g)->strip[lVar30];
      uVar11 = (uint)sVar32;
      uVar8 = uVar11 & 0x7c000000;
      if (((ulong)uVar8 == 0x24000000) || (uVar8 == 0x2c000000)) {
        lVar31 = (ulong)(uVar11 & 0x3ffffff) + lVar30;
      }
      else {
        lVar31 = lVar30;
        if (uVar8 == 0x3c000000) {
          while (((uint)sVar32 & 0x7c000000) != 0x48000000) {
            lVar31 = lVar31 + (ulong)((uint)sVar32 & 0x3ffffff);
            sVar32 = (local_c0.g)->strip[lVar31];
          }
        }
      }
      lVar36 = lVar31 + 1;
      pcVar17 = pcVar21;
      switch((ulong)uVar8 - 0x4000000 >> 0x1a) {
      case 1:
      case 4:
      case 5:
        pcVar17 = pcVar21 + 1;
        break;
      case 8:
        pcVar20 = pcVar24;
        do {
          pcVar17 = lslow(&local_c0,pcVar21,pcVar20,lVar30,lVar36);
          pcVar19 = lslow(&local_c0,pcVar17,pcVar24,lVar36,stop);
          pcVar20 = pcVar17 + -1;
        } while (pcVar19 != pcVar24);
        do {
          pcVar20 = lslow(&local_c0,pcVar21,pcVar17,lVar30 + 1,lVar31);
          if (pcVar20 == (char *)0x0) break;
          bVar40 = pcVar20 != pcVar21;
          pcVar21 = pcVar20;
        } while (bVar40);
        break;
      case 10:
        pcVar20 = pcVar24;
        do {
          pcVar17 = lslow(&local_c0,pcVar21,pcVar20,lVar30,lVar36);
          pcVar19 = lslow(&local_c0,pcVar17,pcVar24,lVar36,stop);
          pcVar20 = pcVar17 + -1;
        } while (pcVar19 != pcVar24);
        lslow(&local_c0,pcVar21,pcVar17,lVar30 + 1,lVar31);
        break;
      case 0xc:
        *(long *)((long)&(local_c0.pmatch)->rm_so + (ulong)((uVar11 & 0x3ffffff) << 4)) =
             (long)pcVar21 - (long)local_c0.offp;
        break;
      case 0xd:
        *(long *)((long)&(local_c0.pmatch)->rm_eo + (ulong)((uVar11 & 0x3ffffff) << 4)) =
             (long)pcVar21 - (long)local_c0.offp;
        break;
      case 0xe:
        pcVar20 = pcVar24;
        do {
          pcVar17 = lslow(&local_c0,pcVar21,pcVar20,lVar30,lVar36);
          pcVar19 = lslow(&local_c0,pcVar17,pcVar24,lVar36,stop);
          pcVar20 = pcVar17 + -1;
        } while (pcVar19 != pcVar24);
        lVar31 = (ulong)((uint)(local_c0.g)->strip[lVar30] & 0x3ffffff) + lVar30 + -1;
        while (pcVar20 = lslow(&local_c0,pcVar21,pcVar17,lVar30 + 1,lVar31), pcVar20 != pcVar17) {
          lVar30 = lVar31 + 1;
          uVar26 = (ulong)((uint)(local_c0.g)->strip[lVar31 + 1] & 0x3ffffff);
          lVar38 = uVar26 + lVar31 + 1;
          lVar31 = uVar26 + lVar31;
          if ((*(uint *)((local_c0.g)->strip + lVar38) & 0x7c000000) != 0x44000000) {
            lVar31 = lVar38;
          }
        }
      }
      goto switchD_00107a13_caseD_2;
    }
  }
  else {
    lVar36 = prVar2->nplus;
    if (local_c0.lastpos == (char **)0x0 && 0 < lVar36) {
      local_c0.lastpos = (char **)malloc(lVar36 * 8 + 8);
    }
    if (local_c0.lastpos == (char **)0x0 && 0 < lVar36) {
      free(prVar6);
      goto LAB_00107e8c;
    }
    pcVar21 = lbackref(&local_c0,local_c0.coldp,pcVar24,lVar39,stop,0);
  }
  if (pcVar21 != (char *)0x0) {
LAB_00107dfc:
    if (uVar14 != 0) {
LAB_00107e04:
      *__pmatch = (regmatch_t)((long)local_c0.coldp - (long)local_c0.offp);
      __pmatch[1] = (regmatch_t)((long)pcVar24 - (long)local_c0.offp);
      if (1 < uVar14) {
        lVar39 = 0x10;
        for (uVar26 = 1; uVar14 != uVar26; uVar26 = uVar26 + 1) {
          puVar34 = (undefined8 *)((long)&__pmatch->rm_so + lVar39);
          if ((local_c0.g)->nsub < uVar26) {
            *(undefined4 *)puVar34 = 0xffffffff;
            *(undefined4 *)((long)puVar34 + 4) = 0xffffffff;
            *(undefined4 *)(puVar34 + 1) = 0xffffffff;
            *(undefined4 *)((long)puVar34 + 0xc) = 0xffffffff;
          }
          else {
            puVar1 = (undefined8 *)((long)&(local_c0.pmatch)->rm_so + lVar39);
            uVar4 = puVar1[1];
            *puVar34 = *puVar1;
            puVar34[1] = uVar4;
          }
          lVar39 = lVar39 + 0x10;
        }
      }
    }
LAB_00107e6d:
    free(local_c0.pmatch);
    free(local_c0.lastpos);
    iVar7 = 0;
LAB_00107e8c:
    free(local_c0.space);
    return iVar7;
  }
  pcVar17 = (char *)0x0;
  while( true ) {
    if (pcVar17 != (char *)0x0) goto LAB_00107dfc;
    if ((pcVar24 <= local_c0.coldp) ||
       (pcVar24 = lslow(&local_c0,local_c0.coldp,pcVar24 + -1,lVar39,stop), pcVar24 == (char *)0x0))
    break;
    pcVar17 = lbackref(&local_c0,local_c0.coldp,pcVar24,lVar39,stop,0);
  }
  pcVar24 = local_c0.coldp + 1;
  pcVar17 = (char *)CONCAT44(local_c0.st._4_4_,local_c0.st._0_4_);
  local_d0 = local_c0.tmp;
  pcVar21 = local_c0.beginp;
  pcVar20 = local_c0.fresh;
  goto LAB_00107597;
LAB_00107041:
  if ((uVar8 & uVar11) == 0) {
    return 1;
  }
  local_c0.coldp = pcVar21;
  if ((local_38 == 0) && (prVar2->backrefs == 0)) goto LAB_00107dde;
  while (pcVar24 = local_c0.coldp,
        pcVar17 = sslow((smat *)&local_c0,local_c0.coldp,pcVar15,lVar39,lVar36),
        pcVar17 == (char *)0x0) {
    local_c0.coldp = pcVar24 + 1;
  }
  if ((sVar37 == 1) && (prVar2->backrefs == 0)) goto LAB_00107d81;
  sVar29 = prVar5->nsub;
  prVar18 = local_c0.pmatch;
  if ((local_c0.pmatch == (regmatch_t *)0x0) &&
     (prVar18 = (regmatch_t *)malloc(sVar29 * 0x10 + 0x10), local_c0.pmatch = prVar18,
     prVar18 == (regmatch_t *)0x0)) {
    return 0xc;
  }
  while( true ) {
    pcVar21 = local_c0.offp;
    prVar6 = local_c0.pmatch;
    bVar40 = sVar29 == 0;
    sVar29 = sVar29 - 1;
    if (bVar40) break;
    *(undefined4 *)&prVar18[1].rm_so = 0xffffffff;
    *(undefined4 *)((long)&prVar18[1].rm_so + 4) = 0xffffffff;
    *(undefined4 *)&prVar18[1].rm_eo = 0xffffffff;
    *(undefined4 *)((long)&prVar18[1].rm_eo + 4) = 0xffffffff;
    prVar18 = prVar18 + 1;
  }
  if ((prVar2->backrefs == 0) && (lVar30 = lVar39, (local_c0.eflags & 0x400U) == 0)) {
switchD_001071be_caseD_2:
    local_120 = pcVar24;
    lVar31 = lVar30;
    sVar37 = local_38;
    if (lVar31 < lVar36) {
      psVar3 = prVar5->strip;
      sVar32 = psVar3[lVar31];
      uVar9 = (uint)sVar32;
      uVar11 = uVar9 & 0x7c000000;
      if (((ulong)uVar11 == 0x24000000) || (uVar11 == 0x2c000000)) {
        lVar38 = (ulong)(uVar9 & 0x3ffffff) + lVar31;
      }
      else {
        lVar38 = lVar31;
        if (uVar11 == 0x3c000000) {
          while (((uint)sVar32 & 0x7c000000) != 0x48000000) {
            lVar38 = lVar38 + (ulong)((uint)sVar32 & 0x3ffffff);
            sVar32 = psVar3[lVar38];
          }
        }
      }
      lVar30 = lVar38 + 1;
      pcVar24 = local_120;
      switch((ulong)uVar11 - 0x4000000 >> 0x1a) {
      case 1:
      case 4:
      case 5:
        pcVar24 = local_120 + 1;
        break;
      case 8:
        pcVar20 = pcVar17;
        do {
          pcVar24 = sslow((smat *)&local_c0,local_120,pcVar20,lVar31,lVar30);
          pcVar19 = sslow((smat *)&local_c0,pcVar24,pcVar17,lVar30,lVar36);
          pcVar20 = pcVar24 + -1;
        } while (pcVar19 != pcVar17);
        do {
          pcVar20 = sslow((smat *)&local_c0,local_120,pcVar24,lVar31 + 1,lVar38);
          lVar39 = local_48;
          if (pcVar20 == (char *)0x0) break;
          bVar40 = pcVar20 != local_120;
          local_120 = pcVar20;
        } while (bVar40);
        break;
      case 10:
        pcVar20 = pcVar17;
        do {
          pcVar24 = sslow((smat *)&local_c0,local_120,pcVar20,lVar31,lVar30);
          pcVar19 = sslow((smat *)&local_c0,pcVar24,pcVar17,lVar30,lVar36);
          pcVar20 = pcVar24 + -1;
        } while (pcVar19 != pcVar17);
        sslow((smat *)&local_c0,local_120,pcVar24,lVar31 + 1,lVar38);
        lVar39 = local_48;
        break;
      case 0xc:
        *(long *)((long)&prVar6->rm_so + (ulong)((uVar9 & 0x3ffffff) << 4)) =
             (long)local_120 - (long)pcVar21;
        break;
      case 0xd:
        *(long *)((long)&prVar6->rm_eo + (ulong)((uVar9 & 0x3ffffff) << 4)) =
             (long)local_120 - (long)pcVar21;
        break;
      case 0xe:
        pcVar20 = pcVar17;
        do {
          pcVar24 = sslow((smat *)&local_c0,local_120,pcVar20,lVar31,lVar30);
          pcVar19 = sslow((smat *)&local_c0,pcVar24,pcVar17,lVar30,lVar36);
          lVar39 = local_48;
          pcVar20 = pcVar24 + -1;
        } while (pcVar19 != pcVar17);
        lVar38 = lVar31 + (ulong)(uVar9 & 0x3ffffff) + -1;
        while (pcVar20 = sslow((smat *)&local_c0,local_120,pcVar24,lVar31 + 1,lVar38),
              pcVar20 != pcVar24) {
          lVar31 = lVar38 + 1;
          uVar26 = (ulong)((uint)psVar3[lVar38 + 1] & 0x3ffffff);
          lVar33 = uVar26 + lVar38 + 1;
          lVar38 = uVar26 + lVar38;
          if ((*(uint *)(psVar3 + lVar33) & 0x7c000000) != 0x44000000) {
            lVar38 = lVar33;
          }
        }
      }
      goto switchD_001071be_caseD_2;
    }
  }
  else {
    lVar30 = prVar2->nplus;
    if (local_c0.lastpos == (char **)0x0 && 0 < lVar30) {
      local_c0.lastpos = (char **)malloc(lVar30 * 8 + 8);
    }
    if (local_c0.lastpos == (char **)0x0 && 0 < lVar30) {
      free(prVar6);
      return 0xc;
    }
    local_120 = sbackref((smat *)&local_c0,pcVar24,pcVar17,lVar39,lVar36,0);
  }
  if (local_120 != (char *)0x0) {
LAB_00107d74:
    pcVar24 = local_c0.coldp;
    if (sVar37 != 0) {
LAB_00107d81:
      *__pmatch = (regmatch_t)((long)pcVar24 - (long)local_c0.offp);
      __pmatch[1] = (regmatch_t)((long)pcVar17 - (long)local_c0.offp);
      if (1 < sVar37) {
        lVar39 = 0x10;
        for (uVar26 = 1; sVar37 != uVar26; uVar26 = uVar26 + 1) {
          puVar34 = (undefined8 *)((long)&__pmatch->rm_so + lVar39);
          if ((local_c0.g)->nsub < uVar26) {
            *(undefined4 *)puVar34 = 0xffffffff;
            *(undefined4 *)((long)puVar34 + 4) = 0xffffffff;
            *(undefined4 *)(puVar34 + 1) = 0xffffffff;
            *(undefined4 *)((long)puVar34 + 0xc) = 0xffffffff;
          }
          else {
            puVar1 = (undefined8 *)((long)&(local_c0.pmatch)->rm_so + lVar39);
            uVar4 = puVar1[1];
            *puVar34 = *puVar1;
            puVar34[1] = uVar4;
          }
          lVar39 = lVar39 + 0x10;
        }
      }
    }
LAB_00107dde:
    free(local_c0.pmatch);
    free(local_c0.lastpos);
    return 0;
  }
  pcVar21 = (char *)0x0;
  while( true ) {
    pcVar24 = local_c0.coldp;
    if (pcVar21 != (char *)0x0) goto LAB_00107d74;
    if ((pcVar17 <= local_c0.coldp) ||
       (pcVar17 = sslow((smat *)&local_c0,local_c0.coldp,pcVar17 + -1,lVar39,lVar36),
       pcVar17 == (char *)0x0)) break;
    pcVar21 = sbackref((smat *)&local_c0,pcVar24,pcVar17,lVar39,lVar36,0);
  }
  pcVar24 = pcVar24 + 1;
  goto LAB_00106d9f;
}

Assistant:

int				/* 0 success, REG_NOMATCH failure */
regexec(preg, string, nmatch, pmatch, eflags)
const regex_t *preg;
const char *string;
size_t nmatch;
regmatch_t pmatch[];
int eflags;
{
	register struct re_guts *g = preg->re_g;
#ifdef REDEBUG
#	define	GOODFLAGS(f)	(f)
#else
#	define	GOODFLAGS(f)	((f)&(REG_NOTBOL|REG_NOTEOL|REG_STARTEND))
#endif

	if (preg->re_magic != MAGIC1 || g->magic != MAGIC2)
		return(REG_BADPAT);
	assert(!(g->iflags&BAD));
	if (g->iflags&BAD)		/* backstop for no-debug case */
		return(REG_BADPAT);
	eflags = GOODFLAGS(eflags);

	if (g->nstates <= CHAR_BIT*sizeof(states1) && !(eflags&REG_LARGE))
		return(smatcher(g, (char *)string, nmatch, pmatch, eflags));
	else
		return(lmatcher(g, (char *)string, nmatch, pmatch, eflags));
}